

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

XmlWriter * __thiscall Catch::XmlWriter::writeAttribute(XmlWriter *this,string *name,bool attribute)

{
  ostream *poVar1;
  undefined3 in_register_00000011;
  char *pcVar2;
  
  poVar1 = std::operator<<(this->m_os,' ');
  poVar1 = std::operator<<(poVar1,(string *)name);
  poVar1 = std::operator<<(poVar1,"=\"");
  pcVar2 = "false";
  if (CONCAT31(in_register_00000011,attribute) != 0) {
    pcVar2 = "true";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,'\"');
  return this;
}

Assistant:

XmlWriter& XmlWriter::writeAttribute( std::string const& name, bool attribute ) {
        m_os << ' ' << name << "=\"" << ( attribute ? "true" : "false" ) << '"';
        return *this;
    }